

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O0

bool __thiscall Pig::skipWS(Pig *this)

{
  ulong uVar1;
  bool bVar2;
  uint c_00;
  element_type *input;
  size_type local_28;
  size_type prev;
  int c;
  size_type save;
  Pig *this_local;
  
  uVar1 = this->_cursor;
  local_28 = this->_cursor;
  do {
    input = std::
            __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    c_00 = utf8_next_char(input,&this->_cursor);
    if (c_00 == 0) {
LAB_001264cd:
      return uVar1 < this->_cursor;
    }
    bVar2 = unicodeWhitespace(c_00);
    if (!bVar2) {
      this->_cursor = local_28;
      goto LAB_001264cd;
    }
    local_28 = this->_cursor;
  } while( true );
}

Assistant:

bool Pig::skipWS ()
{
  auto save = _cursor;

  int c;
  auto prev = _cursor;
  while ((c = utf8_next_char (*_text, _cursor)))
  {
    if (! unicodeWhitespace (c))
    {
      _cursor = prev;
      break;
    }
    prev = _cursor;
  }

  return _cursor > save;
}